

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secant.c
# Opt level: O0

int bfgs_min(custom_function *funcpt,custom_gradient *funcgrad,double *xi,int N,double *dx,
            double fsval,double maxstep,int MAXITER,int *niter,double eps,double gtol,double stol,
            double *xf)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double *f;
  double *array;
  double *xi_00;
  double *x;
  void *__ptr;
  double *L_00;
  double *f_00;
  double eps2_00;
  double dVar4;
  double dVar5;
  double *jacf;
  double *step;
  double *L;
  double *xc;
  double *scheck;
  double *hess;
  double *jac;
  double eps2;
  double fxf;
  double stop0;
  double den;
  double num;
  double fx;
  double dt2;
  double dt1;
  int retval;
  int siter;
  int i;
  int gfdcode;
  int rcode;
  double stol_local;
  double gtol_local;
  double eps_local;
  double dStack_40;
  int MAXITER_local;
  double maxstep_local;
  double fsval_local;
  double *dx_local;
  int N_local;
  double *xi_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  
  f = (double *)malloc((long)N << 3);
  array = (double *)malloc((long)N << 3);
  xi_00 = (double *)malloc((long)N << 3);
  x = (double *)malloc((long)N << 3);
  __ptr = malloc((long)N * 8 * (long)N);
  L_00 = (double *)malloc((long)N * 8 * (long)N);
  f_00 = (double *)malloc((long)N << 3);
  i = 0;
  *niter = 0;
  eps2_00 = sqrt(eps);
  for (retval = 0; retval < N; retval = retval + 1) {
    xi[retval] = dx[retval] * xi[retval];
    dx[retval] = 1.0 / dx[retval];
  }
  dVar4 = (*funcpt->funcpt)(xi,N,funcpt->params);
  if ((1.79769313486232e+308 <= dVar4) || (dVar4 <= -1.79769313486232e+308)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    i = 0xf;
  }
  if (NAN(dVar4)) {
    printf("Program Exiting as the function returns NaN");
    i = 0xf;
  }
  iVar2 = grad_fd(funcpt,funcgrad,xi,N,dx,eps2_00,f);
  if (iVar2 == 0xf) {
    i = 0xf;
  }
  dStack_40 = maxstep;
  if (maxstep <= 0.0) {
    fx = 0.0;
    dt2 = 0.0;
    for (retval = 0; retval < N; retval = retval + 1) {
      dt2 = dx[retval] * dx[retval] + dt2;
      fx = dx[retval] * xi[retval] * dx[retval] * xi[retval] + fx;
    }
    dVar5 = sqrt(dt2);
    dStack_40 = sqrt(fx);
    if (dStack_40 < dVar5) {
      dStack_40 = dVar5;
    }
    dStack_40 = dStack_40 * 1000.0;
  }
  if (ABS(dVar4) <= ABS(fsval)) {
    stop0 = ABS(fsval);
  }
  else {
    stop0 = ABS(dVar4);
  }
  for (retval = 0; retval < N; retval = retval + 1) {
    if (ABS(xi[retval]) <= 1.0 / ABS(dx[retval])) {
      den = 1.0 / ABS(dx[retval]);
    }
    else {
      den = ABS(xi[retval]);
    }
    array[retval] = (ABS(f[retval]) * den) / stop0;
  }
  dVar5 = array_max_abs(array,N);
  if (dVar5 <= gtol * 0.001) {
    i = 1;
    for (retval = 0; retval < N; retval = retval + 1) {
      xf[retval] = xi[retval];
    }
  }
  inithess_lower(L_00,N,dVar4,fsval,dx);
  for (retval = 0; retval < N; retval = retval + 1) {
    xi_00[retval] = xi[retval];
  }
  while( true ) {
    bVar1 = false;
    if (i == 0) {
      bVar1 = *niter < MAXITER;
    }
    if (!bVar1) goto LAB_00140476;
    *niter = *niter + 1;
    scale(f,1,N,-1.0);
    linsolve_lower(L_00,N,f,x);
    scale(f,1,N,-1.0);
    iVar2 = lnsrch(funcpt,xi_00,f,x,N,dx,dStack_40,stol,xf);
    dVar4 = (*funcpt->funcpt)(xf,N,funcpt->params);
    if ((1.79769313486232e+308 <= dVar4) || (dVar4 <= -1.79769313486232e+308)) {
      printf("Program Exiting as the function value exceeds the maximum double value");
      i = 0xf;
      goto LAB_00140476;
    }
    if (NAN(dVar4)) {
      printf("Program Exiting as the function returns NaN");
      i = 0xf;
      goto LAB_00140476;
    }
    iVar3 = grad_fd(funcpt,funcgrad,xf,N,dx,eps2_00,f_00);
    if (iVar3 == 0xf) break;
    i = stopcheck(dVar4,N,xi_00,xf,f_00,dx,fsval,gtol,stol,iVar2);
    bfgs_factored(L_00,N,eps,xi_00,xf,f,f_00);
    for (retval = 0; retval < N; retval = retval + 1) {
      xi_00[retval] = xf[retval];
      f[retval] = f_00[retval];
    }
  }
  i = 0xf;
LAB_00140476:
  if ((i == 0) && (MAXITER <= *niter)) {
    i = 4;
  }
  for (retval = 0; retval < N; retval = retval + 1) {
    xi[retval] = dx[retval] * xi[retval];
    dx[retval] = 1.0 / dx[retval];
  }
  free(f);
  free(__ptr);
  free(array);
  free(xi_00);
  free(L_00);
  free(x);
  free(f_00);
  return i;
}

Assistant:

int bfgs_min(custom_function *funcpt, custom_gradient *funcgrad, double *xi, int N, double *dx, double fsval,double maxstep, int MAXITER, int *niter,
		double eps,double gtol,double stol,double *xf)  {
	int rcode,gfdcode;
	int i,siter,retval;
	double dt1,dt2;
	double fx,num,den,stop0,fxf,eps2;
	double *jac,*hess,*scheck,*xc,*L,*step,*jacf;
	
	jac = (double*) malloc(sizeof(double) *N);
	scheck = (double*) malloc(sizeof(double) *N);
	xc = (double*) malloc(sizeof(double) *N);
	step = (double*) malloc(sizeof(double) *N);
	hess = (double*) malloc(sizeof(double) *N * N);
	L = (double*) malloc(sizeof(double) *N * N);
	jacf = (double*) malloc(sizeof(double) *N);
	
	/*
	 * Return Codes
	 * 
	 * Codes 1,2,3 denote possible success.
	 * Codes 0 and 4 denote failure.
	 * 
	 * 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	 * 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence not achieved.
	 15 -  Failure as Inf/Nan Values encountered 
	 * 
	 */ 
	
	rcode = 0;
	*niter = 0;
	siter = MAXITER;
	eps2 = sqrt(eps);
	gfdcode = 0;

	//set values
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	fx = FUNCPT_EVAL(funcpt, xi, N);
	if (fx >= DBL_MAX || fx <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		rcode = 15;
	}
	if (fx != fx) {
		printf("Program Exiting as the function returns NaN");
		rcode = 15;
	}

	gfdcode = grad_fd(funcpt,funcgrad,xi,N,dx,eps2,jac);
	if (gfdcode == 15) {
		rcode = 15;
	}


	//maxstep = 1000.0; // Needs to be set at a much higher value proportional to l2 norm of dx

	if (maxstep <= 0.0) {
		maxstep = 1000.0;
		dt1 = dt2 = 0.0;
		for (i = 0; i < N; ++i) {
			dt1 += dx[i] * dx[i];
			dt2 += dx[i] * xi[i] * dx[i] * xi[i];
		}

		dt1 = sqrt(dt1);
		dt2 = sqrt(dt2);

		if (dt1 > dt2) {
			maxstep *= dt1;
		}
		else {
			maxstep *= dt2;
		}
	}
	
	//Check Stop0
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xi[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xi[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);
	
	if (stop0 <= gtol * 1e-03) {
		rcode = 1;
		for(i = 0; i < N;++i) {
			xf[i] = xi[i];
		}
	}
	
	//hessian_fd(funcpt,xi,N,dx,hess);
	inithess_lower(L,N,fx,fsval,dx);
	
	for(i = 0; i < N;++i) {
		xc[i] = xi[i];
	}
	
	while (rcode == 0 && *niter < siter) {
		*niter = *niter + 1;
		scale(jac,1,N,-1.0);
		
		linsolve_lower(L,N,jac,step);
		
		scale(jac,1,N,-1.0);

		retval = lnsrch(funcpt,xc,jac,step,N,dx,maxstep,stol,xf);

		fxf = FUNCPT_EVAL(funcpt, xf, N);
		if (fxf >= DBL_MAX || fxf <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			rcode = 15;
			break;
		}
		if (fxf != fxf) {
			printf("Program Exiting as the function returns NaN");
			rcode = 15;
			break;
		}

		gfdcode = grad_fd(funcpt,funcgrad,xf,N,dx,eps2,jacf);
		if (gfdcode == 15) {
			rcode = 15;
			break;
		}
		rcode = stopcheck(fxf,N,xc,xf,jacf,dx,fsval,gtol,stol,retval);
		//hessian_fd(funcpt,xf,N,dx,hess);
		//bfgs_naive(hess,N,xc,xf,jac,jacf);
		bfgs_factored(L,N,eps,xc,xf,jac,jacf);
		for(i = 0; i < N;++i) {
			xc[i] = xf[i];
			jac[i] = jacf[i];
		}
	}
	
	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	}
	
	for(i = 0; i < N;++i) {
		xi[i] *= dx[i];
		dx[i] = 1.0 / dx[i];
	}
	
	free(jac);
	free(hess);
	free(scheck);
	free(xc);
	free(L);
	free(step);
	free(jacf);
	return rcode;
}